

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O2

Node * __thiscall
mapbox::detail::Earcut<unsigned_int>::
ObjectPool<mapbox::detail::Earcut<unsigned_int>::Node,std::allocator<mapbox::detail::Earcut<unsigned_int>::Node>>
::construct<unsigned_int_const&,double_const&,double_const&>
          (ObjectPool<mapbox::detail::Earcut<unsigned_int>::Node,std::allocator<mapbox::detail::Earcut<unsigned_int>::Node>>
           *this,uint *args,double *args_1,double *args_2)

{
  undefined8 *puVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  pointer pNVar5;
  ulong uVar6;
  long lVar7;
  
  uVar6 = *(ulong *)(this + 8);
  if (*(ulong *)(this + 0x10) <= uVar6) {
    pNVar5 = std::allocator_traits<std::allocator<mapbox::detail::Earcut<unsigned_int>::Node>_>::
             allocate((allocator_type *)(this + 0x30),*(ulong *)(this + 0x10));
    *(pointer *)this = pNVar5;
    std::
    vector<mapbox::detail::Earcut<unsigned_int>::Node*,std::allocator<mapbox::detail::Earcut<unsigned_int>::Node*>>
    ::emplace_back<mapbox::detail::Earcut<unsigned_int>::Node*&>
              ((vector<mapbox::detail::Earcut<unsigned_int>::Node*,std::allocator<mapbox::detail::Earcut<unsigned_int>::Node*>>
                *)(this + 0x18),(Node **)this);
    uVar6 = 0;
  }
  lVar4 = *(long *)this;
  *(ulong *)(this + 8) = uVar6 + 1;
  lVar7 = uVar6 * 0x48;
  dVar2 = *args_1;
  dVar3 = *args_2;
  *(uint *)(lVar4 + lVar7) = *args;
  *(double *)(lVar4 + 8 + lVar7) = dVar2;
  *(double *)(lVar4 + 0x10 + lVar7) = dVar3;
  *(undefined4 *)(lVar4 + 0x28 + lVar7) = 0;
  puVar1 = (undefined8 *)(lVar4 + 0x18 + lVar7);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1 = (undefined8 *)(lVar4 + 0x30 + lVar7);
  *puVar1 = 0;
  puVar1[1] = 0;
  *(undefined1 *)(lVar4 + 0x40 + lVar7) = 0;
  return (Node *)(lVar4 + lVar7);
}

Assistant:

T* construct(Args&&... args) {
            if (currentIndex >= blockSize) {
                currentBlock = alloc_traits::allocate(alloc, blockSize);
                allocations.emplace_back(currentBlock);
                currentIndex = 0;
            }
            T* object = &currentBlock[currentIndex++];
            alloc_traits::construct(alloc, object, std::forward<Args>(args)...);
            return object;
        }